

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

string * __thiscall
glcts::ArraysOfArrays::ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES>
::recursively_initialise
          (string *__return_storage_ptr__,
          ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *this,
          string *var_type,size_t dimension_index,string *init_string)

{
  string local_140;
  string local_120;
  string local_100;
  int local_e0;
  allocator<char> local_d9;
  int sub_script_index;
  string local_b8 [32];
  string local_98 [32];
  ulong local_78;
  size_t indent_index;
  string local_68 [8];
  string prefix;
  string *init_string_local;
  size_t dimension_index_local;
  string *var_type_local;
  ConstructorsAndUnsizedDeclConstructors1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  string *temp_string;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (dimension_index == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)init_string);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_68,"\n",(allocator<char> *)((long)&indent_index + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&indent_index + 7));
    for (local_78 = dimension_index; local_78 < 9; local_78 = local_78 + 1) {
      std::__cxx11::string::operator+=(local_68,"    ");
    }
    std::__cxx11::string::string(local_b8,(string *)var_type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&sub_script_index,"[]",&local_d9);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_98,this,local_b8,&sub_script_index,dimension_index);
    std::__cxx11::string::operator+=(local_68,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&sub_script_index);
    std::allocator<char>::~allocator(&local_d9);
    std::__cxx11::string::~string(local_b8);
    std::__cxx11::string::operator+=(local_68,"(");
    for (local_e0 = 0; local_e0 < 2; local_e0 = local_e0 + 1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_68);
      std::__cxx11::string::string((string *)&local_120,(string *)var_type);
      std::__cxx11::string::string((string *)&local_140,(string *)init_string);
      recursively_initialise(&local_100,this,&local_120,dimension_index - 1,&local_140);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::operator=(local_68,", ");
      if (local_e0 == 1) break;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    std::__cxx11::string::~string(local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ConstructorsAndUnsizedDeclConstructors1<API>::recursively_initialise(std::string var_type,
																				 size_t		 dimension_index,
																				 std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = init_string;
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";
		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";
			if (sub_script_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}